

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void Test_Template_Inheritence::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  Template *pTVar17;
  allocator local_561;
  string local_560 [32];
  TemplateString local_540;
  TemplateString local_520;
  TemplateString local_500;
  TemplateString local_4e0;
  TemplateString local_4c0;
  TemplateString local_4a0;
  TemplateDictionary local_480 [8];
  TemplateDictionary incdict;
  allocator local_409;
  string local_408 [32];
  ctemplate local_3e8 [8];
  string incname;
  allocator local_3c1;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [32];
  TemplateString local_378;
  TemplateString local_358;
  allocator local_331;
  string local_330 [32];
  TemplateString local_310;
  undefined8 local_2f0;
  TemplateDictionary *sec2;
  string local_2e0 [32];
  TemplateString local_2c0;
  TemplateString local_2a0;
  allocator local_279;
  string local_278 [32];
  TemplateString local_258;
  undefined8 local_238;
  TemplateDictionary *sec;
  size_t sStack_228;
  bool local_220;
  undefined7 uStack_21f;
  TemplateId TStack_218;
  TemplateString local_210;
  TemplateString local_1f0;
  TemplateDictionary local_1d0 [8];
  TemplateDictionary dict2;
  allocator local_159;
  string local_158 [32];
  TemplateString local_138;
  TemplateString local_118;
  TemplateString local_f8;
  TemplateString local_d8;
  TemplateDictionary local_b8 [8];
  TemplateDictionary dict;
  allocator local_31;
  string local_30 [32];
  Template *local_10;
  Template *tpl;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,"{{FOO}}{{#SEC}}{{FOO}}{{#SEC}}{{FOO}}{{/SEC}}{{/SEC}}",&local_31);
  pTVar17 = ctemplate::StringToTemplate((string *)local_30,STRIP_WHITESPACE);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_10 = pTVar17;
  ctemplate::TemplateString::TemplateString(&local_d8,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(local_b8,&local_d8,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_f8,"FOO");
  ctemplate::TemplateString::TemplateString(&local_118,"foo");
  TVar1.length_ = local_f8.length_;
  TVar1.ptr_ = local_f8.ptr_;
  TVar1.is_immutable_ = local_f8.is_immutable_;
  TVar1._17_7_ = local_f8._17_7_;
  TVar1.id_ = local_f8.id_;
  TVar12.length_ = local_118.length_;
  TVar12.ptr_ = local_118.ptr_;
  TVar12.is_immutable_ = local_118.is_immutable_;
  TVar12._17_7_ = local_118._17_7_;
  TVar12.id_ = local_118.id_;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar12);
  ctemplate::TemplateString::TemplateString(&local_138,"SEC");
  TVar2.length_ = local_138.length_;
  TVar2.ptr_ = local_138.ptr_;
  TVar2.is_immutable_ = local_138.is_immutable_;
  TVar2._17_7_ = local_138._17_7_;
  TVar2.id_ = local_138.id_;
  ctemplate::TemplateDictionary::ShowSection(TVar2);
  pTVar17 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"foofoofoo",&local_159);
  ctemplate::AssertExpandIs(pTVar17,local_b8,(string *)local_158,true);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  ctemplate::TemplateString::TemplateString(&local_1f0,"dict2");
  ctemplate::TemplateDictionary::TemplateDictionary(local_1d0,&local_1f0,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_210,"FOO");
  ctemplate::TemplateString::TemplateString((TemplateString *)&sec,"foo");
  TVar3.length_ = local_210.length_;
  TVar3.ptr_ = local_210.ptr_;
  TVar3.is_immutable_ = local_210.is_immutable_;
  TVar3._17_7_ = local_210._17_7_;
  TVar3.id_ = local_210.id_;
  TVar13.length_ = sStack_228;
  TVar13.ptr_ = (char *)sec;
  TVar13.is_immutable_ = local_220;
  TVar13._17_7_ = uStack_21f;
  TVar13.id_ = TStack_218;
  ctemplate::TemplateDictionary::SetValue(TVar3,TVar13);
  ctemplate::TemplateString::TemplateString(&local_258,"SEC");
  TVar4.length_ = local_258.length_;
  TVar4.ptr_ = local_258.ptr_;
  TVar4.is_immutable_ = local_258.is_immutable_;
  TVar4._17_7_ = local_258._17_7_;
  TVar4.id_ = local_258.id_;
  local_238 = ctemplate::TemplateDictionary::AddSectionDictionary(TVar4);
  pTVar17 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"foofoofoo",&local_279);
  ctemplate::AssertExpandIs(pTVar17,local_1d0,(string *)local_278,true);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  ctemplate::TemplateString::TemplateString(&local_2a0,"FOO");
  ctemplate::TemplateString::TemplateString(&local_2c0,"bar");
  TVar5.length_ = local_2a0.length_;
  TVar5.ptr_ = local_2a0.ptr_;
  TVar5.is_immutable_ = local_2a0.is_immutable_;
  TVar5._17_7_ = local_2a0._17_7_;
  TVar5.id_ = local_2a0.id_;
  TVar14.length_ = local_2c0.length_;
  TVar14.ptr_ = local_2c0.ptr_;
  TVar14.is_immutable_ = local_2c0.is_immutable_;
  TVar14._17_7_ = local_2c0._17_7_;
  TVar14.id_ = local_2c0.id_;
  ctemplate::TemplateDictionary::SetValue(TVar5,TVar14);
  pTVar17 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"foobarbar",(allocator *)((long)&sec2 + 7));
  ctemplate::AssertExpandIs(pTVar17,local_1d0,(string *)local_2e0,true);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&sec2 + 7));
  ctemplate::TemplateString::TemplateString(&local_310,"SEC");
  TVar6.length_ = local_310.length_;
  TVar6.ptr_ = local_310.ptr_;
  TVar6.is_immutable_ = local_310.is_immutable_;
  TVar6._17_7_ = local_310._17_7_;
  TVar6.id_ = local_310.id_;
  local_2f0 = ctemplate::TemplateDictionary::AddSectionDictionary(TVar6);
  pTVar17 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_330,"foobarbar",&local_331);
  ctemplate::AssertExpandIs(pTVar17,local_1d0,(string *)local_330,true);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  ctemplate::TemplateString::TemplateString(&local_358,"FOO");
  ctemplate::TemplateString::TemplateString(&local_378,"baz");
  TVar7.length_ = local_358.length_;
  TVar7.ptr_ = local_358.ptr_;
  TVar7.is_immutable_ = local_358.is_immutable_;
  TVar7._17_7_ = local_358._17_7_;
  TVar7.id_ = local_358.id_;
  TVar15.length_ = local_378.length_;
  TVar15.ptr_ = local_378.ptr_;
  TVar15.is_immutable_ = local_378.is_immutable_;
  TVar15._17_7_ = local_378._17_7_;
  TVar15.id_ = local_378.id_;
  ctemplate::TemplateDictionary::SetValue(TVar7,TVar15);
  pTVar17 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"foobarbaz",&local_399);
  ctemplate::AssertExpandIs(pTVar17,local_1d0,(string *)local_398,true);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"{{FOO}}{{#SEC}}hi{{/SEC}}\n{{>INC}}",&local_3c1);
  local_10 = ctemplate::StringToTemplate((string *)local_3c0,STRIP_WHITESPACE);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_408,"include {{FOO}}{{#SEC}}invisible{{/SEC}}file\n",&local_409);
  ctemplate::StringToTemplateFile(local_3e8,(string *)local_408);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  ctemplate::TemplateString::TemplateString(&local_4a0,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(local_480,&local_4a0,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_4c0,"SEC");
  TVar8.length_ = local_4c0.length_;
  TVar8.ptr_ = local_4c0.ptr_;
  TVar8.is_immutable_ = local_4c0.is_immutable_;
  TVar8._17_7_ = local_4c0._17_7_;
  TVar8.id_ = local_4c0.id_;
  ctemplate::TemplateDictionary::ShowSection(TVar8);
  ctemplate::TemplateString::TemplateString(&local_4e0,"FOO");
  ctemplate::TemplateString::TemplateString(&local_500,"foo");
  TVar9.length_ = local_4e0.length_;
  TVar9.ptr_ = local_4e0.ptr_;
  TVar9.is_immutable_ = local_4e0.is_immutable_;
  TVar9._17_7_ = local_4e0._17_7_;
  TVar9.id_ = local_4e0.id_;
  TVar16.length_ = local_500.length_;
  TVar16.ptr_ = local_500.ptr_;
  TVar16.is_immutable_ = local_500.is_immutable_;
  TVar16._17_7_ = local_500._17_7_;
  TVar16.id_ = local_500.id_;
  ctemplate::TemplateDictionary::SetValue(TVar9,TVar16);
  ctemplate::TemplateString::TemplateString(&local_520,"INC");
  TVar10.length_ = local_520.length_;
  TVar10.ptr_ = local_520.ptr_;
  TVar10.is_immutable_ = local_520.is_immutable_;
  TVar10._17_7_ = local_520._17_7_;
  TVar10.id_ = local_520.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar10);
  ctemplate::TemplateString::TemplateString(&local_540,(string *)local_3e8);
  TVar11.length_ = local_540.length_;
  TVar11.ptr_ = local_540.ptr_;
  TVar11.is_immutable_ = local_540.is_immutable_;
  TVar11._17_7_ = local_540._17_7_;
  TVar11.id_ = local_540.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar11);
  pTVar17 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_560,"foohiinclude file",&local_561);
  ctemplate::AssertExpandIs(pTVar17,local_480,(string *)local_560,true);
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  ctemplate::TemplateDictionary::~TemplateDictionary(local_480);
  std::__cxx11::string::~string((string *)local_3e8);
  ctemplate::TemplateDictionary::~TemplateDictionary(local_1d0);
  ctemplate::TemplateDictionary::~TemplateDictionary(local_b8);
  return;
}

Assistant:

TEST(Template, Inheritence) {
  Template* tpl = StringToTemplate("{{FOO}}{{#SEC}}{{FOO}}{{#SEC}}{{FOO}}{{/SEC}}{{/SEC}}",
                                   STRIP_WHITESPACE);
  TemplateDictionary dict("dict");
  dict.SetValue("FOO", "foo");
  dict.ShowSection("SEC");
  AssertExpandIs(tpl, &dict, "foofoofoo", true);

  TemplateDictionary dict2("dict2");
  dict2.SetValue("FOO", "foo");
  TemplateDictionary* sec = dict2.AddSectionDictionary("SEC");
  AssertExpandIs(tpl, &dict2, "foofoofoo", true);
  sec->SetValue("FOO", "bar");
  AssertExpandIs(tpl, &dict2, "foobarbar", true);
  TemplateDictionary* sec2 = sec->AddSectionDictionary("SEC");
  AssertExpandIs(tpl, &dict2, "foobarbar", true);
  sec2->SetValue("FOO", "baz");
  AssertExpandIs(tpl, &dict2, "foobarbaz", true);

  // Now test an include template, which shouldn't inherit from its parents
  tpl = StringToTemplate("{{FOO}}{{#SEC}}hi{{/SEC}}\n{{>INC}}",
                         STRIP_WHITESPACE);
  string incname = StringToTemplateFile(
      "include {{FOO}}{{#SEC}}invisible{{/SEC}}file\n");
  TemplateDictionary incdict("dict");
  incdict.ShowSection("SEC");
  incdict.SetValue("FOO", "foo");
  incdict.AddIncludeDictionary("INC")->SetFilename(incname);
  AssertExpandIs(tpl, &incdict, "foohiinclude file", true);
}